

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall
chrono::ChParticleCloud::IntLoadResidual_Mv
          (ChParticleCloud *this,uint off,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  CoeffReturnType pdVar6;
  Scalar *pSVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double *local_c8;
  double dStack_c0;
  double local_b8;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  ChVector<double> local_80;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> local_68 [56];
  
  local_a8 = c;
  dStack_a0 = c;
  for (uVar8 = 0;
      uVar8 < (ulong)((long)(this->particles).
                            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->particles).
                            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar8 = (ulong)((int)uVar8 + 1)) {
    dVar1 = (this->particle_mass).mass;
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,(ulong)off);
    dVar2 = *pdVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,(ulong)off);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = c * dVar1;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar2;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *pSVar7;
    auVar3 = vfmadd213sd_fma(auVar12,auVar9,auVar3);
    *pSVar7 = auVar3._0_8_;
    dVar1 = (this->particle_mass).mass;
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                        (ulong)(off + 1));
    dVar2 = *pdVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                        (ulong)(off + 1));
    auVar10._8_8_ = 0;
    auVar10._0_8_ = c * dVar1;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar2;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *pSVar7;
    auVar3 = vfmadd213sd_fma(auVar13,auVar10,auVar4);
    *pSVar7 = auVar3._0_8_;
    dVar1 = (this->particle_mass).mass;
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                        (ulong)(off + 2));
    dVar2 = *pdVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                        (ulong)(off + 2));
    auVar11._8_8_ = 0;
    auVar11._0_8_ = c * dVar1;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *pSVar7;
    auVar3 = vfmadd213sd_fma(auVar14,auVar11,auVar5);
    *pSVar7 = auVar3._0_8_;
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,w,
               (ulong)(off + 3),3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_80,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)local_68,(type *)0x0);
    ChMatrix33<double>::operator*(&(this->particle_mass).inertia,&local_80);
    local_98 = local_a8 * (double)local_c8;
    dStack_90 = dStack_a0 * dStack_c0;
    local_88 = c * local_b8;
    local_c8 = &local_98;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,R,
               (ulong)(off + 3),3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              (local_68,(MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                         *)&local_c8);
    off = off + 6;
  }
  return;
}

Assistant:

void ChParticleCloud::IntLoadResidual_Mv(const unsigned int off,      // offset in R residual
                                           ChVectorDynamic<>& R,        // result: the R residual, R += c*M*v
                                           const ChVectorDynamic<>& w,  // the w vector
                                           const double c               // a scaling factor
                                           ) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        R(off + 6 * j + 0) += c * GetMass() * w(off + 6 * j + 0);
        R(off + 6 * j + 1) += c * GetMass() * w(off + 6 * j + 1);
        R(off + 6 * j + 2) += c * GetMass() * w(off + 6 * j + 2);
        ChVector<> Iw = c * (particle_mass.GetBodyInertia() * ChVector<>(w.segment(off + 6 * j + 3, 3)));
        R.segment(off + 6 * j + 3, 3) += Iw.eigen();
    }
}